

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O3

void fe_dct3(fe_t *fe,mfcc_t *mfcep,powspec_t *mflogspec)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  melfb_t *pmVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  pmVar5 = fe->mel_fb;
  iVar4 = pmVar5->num_filters;
  if (0 < (long)iVar4) {
    fVar1 = (float)*mfcep;
    bVar3 = fe->num_cepstra;
    fVar2 = (float)pmVar5->sqrt_inv_2n;
    lVar6 = 0;
    do {
      dVar8 = (double)fVar1 * 0.707106781186548;
      if (1 < bVar3) {
        uVar7 = 1;
        do {
          dVar8 = dVar8 + (double)((float)mfcep[uVar7] * (float)pmVar5->mel_cosine[uVar7][lVar6]);
          uVar7 = uVar7 + 1;
        } while (bVar3 != uVar7);
      }
      mflogspec[lVar6] = (powspec_t)(dVar8 * (double)fVar2);
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar4);
  }
  return;
}

Assistant:

void
fe_dct3(fe_t * fe, const mfcc_t * mfcep, powspec_t * mflogspec)
{
    int32 i, j;

    for (i = 0; i < fe->mel_fb->num_filters; ++i) {
        mflogspec[i] = COSMUL(mfcep[0], SQRT_HALF);
        for (j = 1; j < fe->num_cepstra; j++) {
            mflogspec[i] += COSMUL(mfcep[j], fe->mel_fb->mel_cosine[j][i]);
        }
        mflogspec[i] = COSMUL(mflogspec[i], fe->mel_fb->sqrt_inv_2n);
    }
}